

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O3

string * __thiscall
libtorrent::torrent_error_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,torrent_error_alert *this)

{
  uint uVar1;
  error_category *peVar2;
  long lVar3;
  _Alloc_hider _Var4;
  char *pcVar5;
  long *plVar6;
  size_type *psVar7;
  char msg [400];
  string local_1f8;
  string local_1d8;
  char local_1b8 [408];
  
  if ((this->error).failed_ == true) {
    uVar1 = (this->error).val_;
    peVar2 = (this->error).cat_;
    (*peVar2->_vptr_error_category[4])(&local_1d8,peVar2,(ulong)uVar1);
    convert_from_native(&local_1f8,&local_1d8);
    _Var4._M_p = local_1f8._M_dataplus._M_p;
    pcVar5 = aux::stack_allocator::ptr
                       ((this->super_torrent_alert).m_alloc._M_data,
                        (allocation_slot)(this->m_file_idx).m_idx);
    snprintf(local_1b8,400," ERROR: (%d %s) %s",(ulong)uVar1,_Var4._M_p,pcVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    pcVar5 = aux::stack_allocator::ptr
                       ((this->super_torrent_alert).m_alloc._M_data,
                        (allocation_slot)(this->m_file_idx).m_idx);
    snprintf(local_1b8,400," ERROR: %s",pcVar5);
  }
  torrent_alert::message_abi_cxx11_(&local_1f8,&this->super_torrent_alert);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_1f8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar7 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar7) {
    lVar3 = plVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
  }
  __return_storage_ptr__->_M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string torrent_error_alert::message() const
	{
		char msg[400];
		if (error)
		{
			std::snprintf(msg, sizeof(msg), " ERROR: (%d %s) %s"
				, error.value(), convert_from_native(error.message()).c_str()
				, filename());
		}
		else
		{
			std::snprintf(msg, sizeof(msg), " ERROR: %s", filename());
		}
		return torrent_alert::message() + msg;
	}